

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode http_write_header(Curl_easy *data,char *hd,size_t hdlen)

{
  CURLcode CVar1;
  uint uVar2;
  
  Curl_debug(data,CURLINFO_HEADER_IN,hd,hdlen);
  CVar1 = Curl_client_write(data,(uint)((data->req).httpcode - 100U < 100) << 5 | 4,hd,hdlen);
  if (CVar1 == CURLE_OK) {
    uVar2 = 0;
    CVar1 = Curl_bump_headersize(data,hdlen,false);
    if (CVar1 == CURLE_OK) {
      if ((data->req).httpcode - 100U < 100) {
        uVar2 = (data->req).headerbytecount;
      }
      (data->req).deductheadercount = uVar2;
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode http_write_header(struct Curl_easy *data,
                                  const char *hd, size_t hdlen)
{
  CURLcode result;
  int writetype;

  /* now, only output this if the header AND body are requested:
   */
  Curl_debug(data, CURLINFO_HEADER_IN, (char *)hd, hdlen);

  writetype = CLIENTWRITE_HEADER |
    ((data->req.httpcode/100 == 1) ? CLIENTWRITE_1XX : 0);

  result = Curl_client_write(data, writetype, hd, hdlen);
  if(result)
    return result;

  result = Curl_bump_headersize(data, hdlen, FALSE);
  if(result)
    return result;

  data->req.deductheadercount = (100 <= data->req.httpcode &&
                                 199 >= data->req.httpcode) ?
    data->req.headerbytecount : 0;
  return result;
}